

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tty.c
# Opt level: O2

int run_test_tty(void)

{
  int iVar1;
  int file;
  uv_handle_type uVar2;
  uv_loop_t *puVar3;
  int *piVar4;
  FILE *__stream;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  undefined8 uVar8;
  int64_t eval_b_5;
  int64_t eval_b_6;
  int height;
  int width;
  uv_tty_t tty_out;
  uv_tty_t tty_in;
  
  puVar3 = uv_default_loop();
  iVar1 = open64("/dev/tty",0,0);
  __stream = _stderr;
  if (iVar1 < 0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    pcVar7 = "Cannot open /dev/tty as read-only: %s\n";
LAB_0019b1f4:
    fprintf(__stream,pcVar7,pcVar5);
    fflush(_stderr);
    return 7;
  }
  file = open64("/dev/tty",1,0);
  __stream = _stderr;
  if (file < 0) {
    piVar4 = __errno_location();
    pcVar5 = strerror(*piVar4);
    pcVar7 = "Cannot open /dev/tty as write-only: %s\n";
    goto LAB_0019b1f4;
  }
  tty_out.data = (void *)0x0;
  tty_in.data = (void *)0x0;
  uVar2 = uv_guess_handle(-1);
  tty_out.data = (void *)(ulong)uVar2;
  if (tty_in.data == tty_out.data) {
    tty_in.data = (void *)0xe;
    uVar2 = uv_guess_handle(iVar1);
    tty_out.data = (void *)(ulong)uVar2;
    if (tty_in.data == tty_out.data) {
      tty_in.data = (void *)0xe;
      uVar2 = uv_guess_handle(file);
      tty_out.data = (void *)(ulong)uVar2;
      if (tty_in.data == tty_out.data) {
        iVar1 = uv_tty_init(puVar3,&tty_in,iVar1,1);
        tty_out.data = (void *)(long)iVar1;
        if (tty_out.data != (void *)0x0) {
          pcVar7 = "0";
          pcVar5 = "r";
          uVar8 = 0x5f;
          pcVar6 = "==";
          eval_b_5 = (int64_t)tty_out.data;
          eval_b_6 = (int64_t)(void *)0x0;
          goto LAB_0019b573;
        }
        iVar1 = uv_is_readable((uv_stream_t *)&tty_in);
        if (iVar1 == 0) {
          pcVar5 = "uv_is_readable((uv_stream_t*) &tty_in)";
          uVar8 = 0x60;
LAB_0019b42c:
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
                  ,uVar8,pcVar5);
          abort();
        }
        iVar1 = uv_is_writable((uv_stream_t *)&tty_in);
        if (iVar1 != 0) {
          pcVar5 = "!uv_is_writable((uv_stream_t*) &tty_in)";
          uVar8 = 0x61;
          goto LAB_0019b42c;
        }
        iVar1 = uv_tty_init(puVar3,&tty_out,file,0);
        eval_b_5 = (int64_t)iVar1;
        eval_b_6 = 0;
        if ((void *)eval_b_5 == (void *)0x0) {
          iVar1 = uv_is_readable((uv_stream_t *)&tty_out);
          if (iVar1 == 0) {
            iVar1 = uv_is_writable((uv_stream_t *)&tty_out);
            if (iVar1 != 0) {
              iVar1 = uv_tty_get_winsize(&tty_out,&width,&height);
              eval_b_5 = (int64_t)iVar1;
              eval_b_6 = 0;
              if ((void *)eval_b_5 == (void *)0x0) {
                printf("width=%d height=%d\n",(ulong)(uint)width,(ulong)(uint)height);
                eval_b_5 = (int64_t)width;
                if (width == 0 && height == 0) {
                  close_loop(puVar3);
                  eval_b_5 = 0;
                  iVar1 = uv_loop_close(puVar3);
                  eval_b_6 = (int64_t)iVar1;
                  if ((void *)eval_b_6 == (void *)0x0) {
                    uv_library_shutdown();
                    return 7;
                  }
                  pcVar6 = "==";
                  pcVar7 = "uv_loop_close(loop)";
                  pcVar5 = "0";
                  uVar8 = 0x70;
                }
                else {
                  eval_b_6 = 0;
                  if (eval_b_5 < 1) {
                    pcVar6 = ">";
                    pcVar7 = "0";
                    pcVar5 = "width";
                    uVar8 = 0x74;
                  }
                  else {
                    eval_b_5 = (int64_t)height;
                    eval_b_6 = 0;
                    if (eval_b_5 < 1) {
                      pcVar6 = ">";
                      pcVar7 = "0";
                      pcVar5 = "height";
                      uVar8 = 0x75;
                    }
                    else {
                      iVar1 = uv_tty_set_mode(&tty_in,UV_TTY_MODE_RAW);
                      eval_b_5 = (int64_t)iVar1;
                      eval_b_6 = 0;
                      if ((void *)eval_b_5 == (void *)0x0) {
                        iVar1 = uv_tty_set_mode(&tty_in,UV_TTY_MODE_NORMAL);
                        eval_b_5 = (int64_t)iVar1;
                        eval_b_6 = 0;
                        if ((void *)eval_b_5 == (void *)0x0) {
                          piVar4 = __errno_location();
                          *piVar4 = 0;
                          iVar1 = uv_tty_reset_mode();
                          eval_b_5 = (int64_t)iVar1;
                          eval_b_6 = 0;
                          if ((void *)eval_b_5 == (void *)0x0) {
                            iVar1 = uv_tty_reset_mode();
                            eval_b_5 = (int64_t)iVar1;
                            eval_b_6 = 0;
                            if ((void *)eval_b_5 == (void *)0x0) {
                              iVar1 = uv_tty_reset_mode();
                              eval_b_5 = (int64_t)iVar1;
                              eval_b_6 = 0;
                              if ((void *)eval_b_5 == (void *)0x0) {
                                eval_b_5 = (int64_t)*piVar4;
                                eval_b_6 = 0;
                                if ((void *)eval_b_5 == (void *)0x0) {
                                  uv_close((uv_handle_t *)&tty_in,(uv_close_cb)0x0);
                                  uv_close((uv_handle_t *)&tty_out,(uv_close_cb)0x0);
                                  uv_run(puVar3,UV_RUN_DEFAULT);
                                  puVar3 = uv_default_loop();
                                  close_loop(puVar3);
                                  eval_b_5 = 0;
                                  puVar3 = uv_default_loop();
                                  iVar1 = uv_loop_close(puVar3);
                                  eval_b_6 = (int64_t)iVar1;
                                  if ((void *)eval_b_6 == (void *)0x0) {
                                    uv_library_shutdown();
                                    return 0;
                                  }
                                  pcVar6 = "==";
                                  pcVar7 = "uv_loop_close(uv_default_loop())";
                                  pcVar5 = "0";
                                  uVar8 = 0x8d;
                                }
                                else {
                                  pcVar6 = "==";
                                  pcVar7 = "0";
                                  pcVar5 = "(*__errno_location ())";
                                  uVar8 = 0x84;
                                }
                              }
                              else {
                                pcVar6 = "==";
                                pcVar7 = "0";
                                pcVar5 = "uv_tty_reset_mode()";
                                uVar8 = 0x83;
                              }
                            }
                            else {
                              pcVar6 = "==";
                              pcVar7 = "0";
                              pcVar5 = "uv_tty_reset_mode()";
                              uVar8 = 0x82;
                            }
                          }
                          else {
                            pcVar6 = "==";
                            pcVar7 = "0";
                            pcVar5 = "uv_tty_reset_mode()";
                            uVar8 = 0x81;
                          }
                        }
                        else {
                          pcVar6 = "==";
                          pcVar7 = "0";
                          pcVar5 = "r";
                          uVar8 = 0x7d;
                        }
                      }
                      else {
                        pcVar6 = "==";
                        pcVar7 = "0";
                        pcVar5 = "r";
                        uVar8 = 0x79;
                      }
                    }
                  }
                }
              }
              else {
                pcVar6 = "==";
                pcVar7 = "0";
                pcVar5 = "r";
                uVar8 = 0x69;
              }
              goto LAB_0019b573;
            }
            pcVar5 = "uv_is_writable((uv_stream_t*) &tty_out)";
            uVar8 = 0x66;
          }
          else {
            pcVar5 = "!uv_is_readable((uv_stream_t*) &tty_out)";
            uVar8 = 0x65;
          }
          goto LAB_0019b42c;
        }
        pcVar6 = "==";
        pcVar7 = "0";
        pcVar5 = "r";
        uVar8 = 100;
        goto LAB_0019b573;
      }
      pcVar7 = "uv_guess_handle(ttyout_fd)";
      pcVar5 = "UV_TTY";
      uVar8 = 0x5c;
    }
    else {
      pcVar7 = "uv_guess_handle(ttyin_fd)";
      pcVar5 = "UV_TTY";
      uVar8 = 0x5b;
    }
  }
  else {
    pcVar7 = "uv_guess_handle((uv_os_fd_t) -1)";
    pcVar5 = "UV_UNKNOWN_HANDLE";
    uVar8 = 0x59;
  }
  pcVar6 = "==";
  eval_b_5 = (int64_t)tty_in.data;
  eval_b_6 = (int64_t)tty_out.data;
LAB_0019b573:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tty.c"
          ,uVar8,pcVar5,pcVar6,pcVar7,eval_b_5,pcVar6,eval_b_6);
  abort();
}

Assistant:

TEST_IMPL(tty) {
  int r, width, height;
  uv_os_fd_t ttyin_fd, ttyout_fd;
  uv_tty_t tty_in, tty_out;
  uv_loop_t* loop = uv_default_loop();

  /* Make sure we have an FD that refers to a tty */
#ifdef _WIN32
  ttyin_fd = CreateFileA("conin$",
                         GENERIC_READ | GENERIC_WRITE,
                         FILE_SHARE_READ | FILE_SHARE_WRITE,
                         NULL,
                         OPEN_EXISTING,
                         FILE_ATTRIBUTE_NORMAL,
                         NULL);
  ASSERT_PTR_NE(ttyin_fd, INVALID_HANDLE_VALUE);

  ttyout_fd = CreateFileA("conout$",
                          GENERIC_READ | GENERIC_WRITE,
                          FILE_SHARE_READ | FILE_SHARE_WRITE,
                          NULL,
                          OPEN_EXISTING,
                          FILE_ATTRIBUTE_NORMAL,
                          NULL);
  ASSERT_PTR_NE(ttyout_fd, INVALID_HANDLE_VALUE);

#else /* unix */
  ttyin_fd = open("/dev/tty", O_RDONLY, 0);
  if (ttyin_fd < 0) {
    fprintf(stderr, "Cannot open /dev/tty as read-only: %s\n", strerror(errno));
    fflush(stderr);
    return TEST_SKIP;
  }

  ttyout_fd = open("/dev/tty", O_WRONLY, 0);
  if (ttyout_fd < 0) {
    fprintf(stderr, "Cannot open /dev/tty as write-only: %s\n", strerror(errno));
    fflush(stderr);
    return TEST_SKIP;
  }

  ASSERT_GE(ttyin_fd, 0);
  ASSERT_GE(ttyout_fd, 0);
#endif

  ASSERT_EQ(UV_UNKNOWN_HANDLE, uv_guess_handle((uv_os_fd_t) -1));

  ASSERT_EQ(UV_TTY, uv_guess_handle(ttyin_fd));
  ASSERT_EQ(UV_TTY, uv_guess_handle(ttyout_fd));

  r = uv_tty_init(loop, &tty_in, ttyin_fd, 1);  /* Readable. */
  ASSERT_OK(r);
  ASSERT(uv_is_readable((uv_stream_t*) &tty_in));
  ASSERT(!uv_is_writable((uv_stream_t*) &tty_in));

  r = uv_tty_init(loop, &tty_out, ttyout_fd, 0);  /* Writable. */
  ASSERT_OK(r);
  ASSERT(!uv_is_readable((uv_stream_t*) &tty_out));
  ASSERT(uv_is_writable((uv_stream_t*) &tty_out));

  r = uv_tty_get_winsize(&tty_out, &width, &height);
  ASSERT_OK(r);

  printf("width=%d height=%d\n", width, height);

  if (width == 0 && height == 0) {
   /* Some environments such as containers or Jenkins behave like this
    * sometimes */
    MAKE_VALGRIND_HAPPY(loop);
    return TEST_SKIP;
  }

  ASSERT_GT(width, 0);
  ASSERT_GT(height, 0);

  /* Turn on raw mode. */
  r = uv_tty_set_mode(&tty_in, UV_TTY_MODE_RAW);
  ASSERT_OK(r);

  /* Turn off raw mode. */
  r = uv_tty_set_mode(&tty_in, UV_TTY_MODE_NORMAL);
  ASSERT_OK(r);

  /* Calling uv_tty_reset_mode() repeatedly should not clobber errno. */
  errno = 0;
  ASSERT_OK(uv_tty_reset_mode());
  ASSERT_OK(uv_tty_reset_mode());
  ASSERT_OK(uv_tty_reset_mode());
  ASSERT_OK(errno);

  /* TODO check the actual mode! */

  uv_close((uv_handle_t*) &tty_in, NULL);
  uv_close((uv_handle_t*) &tty_out, NULL);

  uv_run(loop, UV_RUN_DEFAULT);

  MAKE_VALGRIND_HAPPY(uv_default_loop());
  return 0;
}